

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

void __thiscall Func::EnsureEquivalentTypeGuards(Func *this)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar3;
  JitArenaAllocator *pJVar4;
  SListCounted<Js::JitEquivalentTypeGuard_*,_Memory::ArenaAllocator> *this_00;
  TrackAllocData local_38;
  Func *local_10;
  Func *this_local;
  
  local_10 = this;
  sourceContextId = GetSourceContextId(this);
  functionId = GetLocalFunctionId(this);
  bVar2 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eafdf0,EquivObjTypeSpecPhase,sourceContextId,functionId);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x63f,
                       "(!Js::Configuration::Global.flags.Off.IsEnabled(((Js::EquivObjTypeSpecPhase)), ((this)->GetSourceContextId()), ((this)->GetLocalFunctionId())))"
                       ,
                       "Why do we have equivalent type guards if we don\'t do equivalent object type spec?"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (this->equivalentTypeGuards == (EquivalentTypeGuardList *)0x0) {
    pJVar4 = this->m_alloc;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_38,
               (type_info *)
               &SListCounted<Js::JitEquivalentTypeGuard*,Memory::ArenaAllocator>::typeinfo,0,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
               ,0x642);
    pJVar4 = (JitArenaAllocator *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pJVar4,&local_38);
    this_00 = (SListCounted<Js::JitEquivalentTypeGuard_*,_Memory::ArenaAllocator> *)
              new<Memory::JitArenaAllocator>(0x18,pJVar4,0x4e98c0);
    SListCounted<Js::JitEquivalentTypeGuard_*,_Memory::ArenaAllocator>::SListCounted
              (this_00,&this->m_alloc->super_ArenaAllocator);
    this->equivalentTypeGuards = this_00;
  }
  return;
}

Assistant:

void
Func::EnsureEquivalentTypeGuards()
{
    AssertMsg(!PHASE_OFF(Js::EquivObjTypeSpecPhase, this), "Why do we have equivalent type guards if we don't do equivalent object type spec?");
    if (this->equivalentTypeGuards == nullptr)
    {
        this->equivalentTypeGuards = JitAnew(this->m_alloc, EquivalentTypeGuardList, this->m_alloc);
    }
}